

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgMatrix.cpp
# Opt level: O3

void __thiscall
dgMatrix::TransformBBox
          (dgMatrix *this,dgVector *p0local,dgVector *p1local,dgVector *p0,dgVector *p1)

{
  uint uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar5;
  undefined8 uVar4;
  undefined4 uVar6;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  dgVector box [8];
  ulong uStack_a0;
  ulong local_98;
  float fStack_90;
  undefined4 uStack_8c;
  ulong local_88;
  uint local_80 [4];
  float local_70;
  undefined4 local_6c;
  undefined4 local_68;
  ulong local_64;
  undefined4 local_5c;
  float local_58;
  undefined4 local_54;
  float local_50;
  undefined4 local_4c;
  float local_48;
  undefined4 local_44;
  undefined4 local_40;
  float local_38;
  undefined4 local_34;
  float local_30;
  undefined4 local_2c;
  float local_28;
  ulong local_24;
  undefined4 local_1c;
  
  local_98._0_4_ = (p0local->super_dgTemplateVector<float>).m_x;
  local_98._4_4_ = (p0local->super_dgTemplateVector<float>).m_y;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = local_98;
  fStack_90 = (p0local->super_dgTemplateVector<float>).m_z;
  uStack_8c = 0x3f800000;
  local_6c = 0x3f800000;
  auVar8 = vmovshdup_avx(auVar8);
  local_64._0_4_ = (p1local->super_dgTemplateVector<float>).m_y;
  local_64._4_4_ = (p1local->super_dgTemplateVector<float>).m_z;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = local_64;
  auVar11 = vmovshdup_avx(auVar11);
  local_80[0] = auVar11._0_4_;
  local_5c = 0x3f800000;
  local_58 = (p1local->super_dgTemplateVector<float>).m_x;
  local_54 = auVar8._0_4_;
  local_4c = 0x3f800000;
  local_80[1] = 0x3f800000;
  local_2c = 0x3f800000;
  local_1c = 0x3f800000;
  uStack_a0 = 0x85863d;
  local_88 = local_98;
  local_80[2] = (undefined4)local_98;
  local_80[3] = (undefined4)local_64;
  local_70 = fStack_90;
  local_68 = (undefined4)local_98;
  local_50 = fStack_90;
  local_48 = local_58;
  local_44 = local_54;
  local_40 = local_80[0];
  local_38 = local_58;
  local_34 = (undefined4)local_64;
  local_30 = fStack_90;
  local_28 = local_58;
  local_24 = local_64;
  TransformTriplex(this,(HaF32 *)&local_98,0x10,(HaF32 *)&local_98,0x10,8);
  lVar7 = 0x18;
  (p0->super_dgTemplateVector<float>).m_x = (float)(undefined4)local_98;
  (p0->super_dgTemplateVector<float>).m_y = (float)local_98._4_4_;
  (p0->super_dgTemplateVector<float>).m_z = fStack_90;
  (p0->super_dgTemplateVector<float>).m_w = (float)uStack_8c;
  (p1->super_dgTemplateVector<float>).m_x = (float)(undefined4)local_98;
  (p1->super_dgTemplateVector<float>).m_y = (float)local_98._4_4_;
  (p1->super_dgTemplateVector<float>).m_z = fStack_90;
  (p1->super_dgTemplateVector<float>).m_w = (float)uStack_8c;
  do {
    uVar2 = (p0->super_dgTemplateVector<float>).m_x;
    uVar5 = (p0->super_dgTemplateVector<float>).m_y;
    auVar9._4_4_ = uVar5;
    auVar9._0_4_ = uVar2;
    auVar9._8_8_ = 0;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = *(ulong *)((long)&uStack_a0 + lVar7);
    auVar8 = vminps_avx(auVar10,auVar9);
    uVar4 = vmovlps_avx(auVar8);
    (p0->super_dgTemplateVector<float>).m_x = (float)(int)uVar4;
    (p0->super_dgTemplateVector<float>).m_y = (float)(int)((ulong)uVar4 >> 0x20);
    uVar1 = *(uint *)((long)&local_98 + lVar7);
    lVar7 = lVar7 + 0x10;
    auVar8 = vminss_avx(ZEXT416(uVar1),ZEXT416((uint)(p0->super_dgTemplateVector<float>).m_z));
    (p0->super_dgTemplateVector<float>).m_z = auVar8._0_4_;
    uVar3 = (p1->super_dgTemplateVector<float>).m_x;
    uVar6 = (p1->super_dgTemplateVector<float>).m_y;
    auVar12._4_4_ = uVar6;
    auVar12._0_4_ = uVar3;
    auVar12._8_8_ = 0;
    auVar8 = vmaxps_avx(auVar10,auVar12);
    uVar4 = vmovlps_avx(auVar8);
    (p1->super_dgTemplateVector<float>).m_x = (float)(int)uVar4;
    (p1->super_dgTemplateVector<float>).m_y = (float)(int)((ulong)uVar4 >> 0x20);
    auVar8 = vmaxss_avx(ZEXT416(uVar1),ZEXT416((uint)(p1->super_dgTemplateVector<float>).m_z));
    (p1->super_dgTemplateVector<float>).m_z = auVar8._0_4_;
  } while (lVar7 != 0x88);
  return;
}

Assistant:

void dgMatrix::TransformBBox (const dgVector& p0local, const dgVector& p1local, dgVector& p0, dgVector& p1) const
{
	dgVector box[8];

	box[0][0] = p0local[0];
	box[0][1] = p0local[1];
	box[0][2] = p0local[2];
	box[0][3] = hacd::HaF32(1.0f);

	box[1][0] = p0local[0];
	box[1][1] = p0local[1];
	box[1][2] = p1local[2];
	box[1][3] = hacd::HaF32(1.0f);

	box[2][0] = p0local[0];
	box[2][1] = p1local[1];
	box[2][2] = p0local[2];
	box[2][3] = hacd::HaF32(1.0f);

	box[3][0] = p0local[0];
	box[3][1] = p1local[1];
	box[3][2] = p1local[2];
	box[3][3] = hacd::HaF32(1.0f);

	box[4][0] = p1local[0];
	box[4][1] = p0local[1];
	box[4][2] = p0local[2];
	box[4][3] = hacd::HaF32(1.0f);

	box[5][0] = p1local[0];
	box[5][1] = p0local[1];
	box[5][2] = p1local[2];
	box[1][3] = hacd::HaF32(1.0f);

	box[6][0] = p1local[0];
	box[6][1] = p1local[1];
	box[6][2] = p0local[2];
	box[6][3] = hacd::HaF32(1.0f);

	box[7][0] = p1local[0];
	box[7][1] = p1local[1];
	box[7][2] = p1local[2];
	box[7][3] = hacd::HaF32(1.0f);

	TransformTriplex (&box[0].m_x, sizeof (dgVector), &box[0].m_x, sizeof (dgVector), 8);

	p0 = box[0];
	p1 = box[0];
	for (hacd::HaI32 i = 1; i < 8; i ++) {
		p0.m_x = GetMin (p0.m_x, box[i].m_x);
		p0.m_y = GetMin (p0.m_y, box[i].m_y);
		p0.m_z = GetMin (p0.m_z, box[i].m_z);

		p1.m_x = GetMax (p1.m_x, box[i].m_x);
		p1.m_y = GetMax (p1.m_y, box[i].m_y);
		p1.m_z = GetMax (p1.m_z, box[i].m_z);
	}
}